

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# happly.h
# Opt level: O3

void __thiscall happly::PLYData::parseASCII(PLYData *this,istream *inStream,bool verbose)

{
  Property *pPVar1;
  char cVar2;
  ostream *poVar3;
  pointer puVar4;
  ulong uVar5;
  ulong uVar6;
  pointer pEVar7;
  string line;
  size_t iTok;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  string local_78;
  pointer local_58;
  undefined8 local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_58 = (this->elements).super__Vector_base<happly::Element,_std::allocator<happly::Element>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  pEVar7 = (this->elements).super__Vector_base<happly::Element,_std::allocator<happly::Element>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pEVar7 != local_58) {
    do {
      if (verbose) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"  - Processing element: ",0x18);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(pEVar7->name)._M_dataplus._M_p,
                            (pEVar7->name)._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
      }
      puVar4 = (pEVar7->properties).
               super__Vector_base<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>,_std::allocator<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((pEVar7->properties).
          super__Vector_base<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>,_std::allocator<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != puVar4) {
        uVar5 = 0;
        do {
          pPVar1 = puVar4[uVar5]._M_t.
                   super___uniq_ptr_impl<happly::Property,_std::default_delete<happly::Property>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_happly::Property_*,_std::default_delete<happly::Property>_>
                   .super__Head_base<0UL,_happly::Property_*,_false>._M_head_impl;
          (*pPVar1->_vptr_Property[2])(pPVar1,pEVar7->count);
          puVar4 = (pEVar7->properties).
                   super__Vector_base<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>,_std::allocator<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar5 = uVar5 + 1;
        } while (uVar5 < (ulong)((long)(pEVar7->properties).
                                       super__Vector_base<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>,_std::allocator<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >>
                                3));
      }
      if (pEVar7->count != 0) {
        uVar5 = 0;
        do {
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          local_78._M_string_length = 0;
          local_78.field_2._M_local_buf[0] = '\0';
          cVar2 = std::ios::widen((char)*(undefined8 *)(*(long *)inStream + -0x18) + (char)inStream)
          ;
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)inStream,(string *)&local_78,cVar2);
          if ((pEVar7->properties).
              super__Vector_base<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>,_std::allocator<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              (pEVar7->properties).
              super__Vector_base<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>,_std::allocator<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            while (local_78._M_string_length == 0) {
              cVar2 = std::ios::widen((char)*(undefined8 *)(*(long *)inStream + -0x18) +
                                      (char)inStream);
              std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)inStream,(string *)&local_78,cVar2);
            }
          }
          anon_unknown_3::tokenSplit(&local_48,&local_78);
          local_50 = 0;
          puVar4 = (pEVar7->properties).
                   super__Vector_base<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>,_std::allocator<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((pEVar7->properties).
              super__Vector_base<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>,_std::allocator<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish != puVar4) {
            uVar6 = 0;
            do {
              pPVar1 = puVar4[uVar6]._M_t.
                       super___uniq_ptr_impl<happly::Property,_std::default_delete<happly::Property>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_happly::Property_*,_std::default_delete<happly::Property>_>
                       .super__Head_base<0UL,_happly::Property_*,_false>._M_head_impl;
              (*pPVar1->_vptr_Property[3])(pPVar1,&local_48,&local_50);
              puVar4 = (pEVar7->properties).
                       super__Vector_base<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>,_std::allocator<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              uVar6 = uVar6 + 1;
            } while (uVar6 < (ulong)((long)(pEVar7->properties).
                                           super__Vector_base<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>,_std::allocator<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish - (long)puVar4
                                    >> 3));
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_48);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p);
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 < pEVar7->count);
      }
      pEVar7 = pEVar7 + 1;
    } while (pEVar7 != local_58);
  }
  return;
}

Assistant:

void parseASCII(std::istream& inStream, bool verbose) {

    using std::string;
    using std::vector;

    // Read all elements
    for (Element& elem : elements) {

      if (verbose) {
        std::cout << "  - Processing element: " << elem.name << std::endl;
      }

      for (size_t iP = 0; iP < elem.properties.size(); iP++) {
        elem.properties[iP]->reserve(elem.count);
      }
      for (size_t iEntry = 0; iEntry < elem.count; iEntry++) {

        string line;
        std::getline(inStream, line);

        // Some .ply files seem to include empty lines before the start of property data (though this is not specified
        // in the format description). We attempt to recover and parse such files by skipping any empty lines.
        if (!elem.properties.empty()) { // if the element has no properties, the line _should_ be blank, presumably
          while (line.empty()) { // skip lines until we hit something nonempty
            std::getline(inStream, line);
          }
        }

        vector<string> tokens = tokenSplit(line);
        size_t iTok = 0;
        for (size_t iP = 0; iP < elem.properties.size(); iP++) {
          elem.properties[iP]->parseNext(tokens, iTok);
        }
      }
    }
  }